

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O0

void finish(gdmf *d)

{
  v_array<float>::delete_v((v_array<float> *)d);
  return;
}

Assistant:

void finish(gdmf& d) { d.scalars.delete_v(); }